

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap3d_topology.cpp
# Opt level: O3

HostFew<Omega_h::Read<int>,_4> *
Omega_h::swap3d_topology
          (HostFew<Omega_h::Read<int>,_4> *__return_storage_ptr__,Mesh *mesh,LOs *keys2edges,
          Read<signed_char> *edge_configs,HostFew<Omega_h::Read<int>,_4> *keys2prods)

{
  int *piVar1;
  char cVar2;
  undefined4 uVar3;
  Alloc *pAVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long *plVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  HostFew<Omega_h::Read<int>,_4> *pHVar8;
  bool bVar9;
  int iVar10;
  bool bVar11;
  Alloc *pAVar12;
  long lVar13;
  undefined8 uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  Alloc *pAVar19;
  byte bVar20;
  byte bVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  Alloc *pAVar29;
  char *__end;
  int iVar30;
  uint uVar31;
  LOs tet_verts2verts;
  LOs edge_verts2verts;
  Read<signed_char> edge_tet_codes;
  LOs edge_tets2tets;
  LOs edges2edge_tets;
  Loop loop;
  HostFew<Omega_h::Write<int>,_4> prod_verts2verts_w;
  Adj edges2tets;
  type f;
  Alloc *local_4c8;
  int local_480;
  Write<int> local_458;
  int local_448 [2];
  undefined8 uStack_440;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined8 local_418;
  Alloc *local_410;
  element_type *local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  element_type *local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  element_type *local_3e8;
  Alloc *local_3e0;
  element_type *local_3d8;
  Alloc *local_3d0;
  element_type *local_3c8;
  HostFew<Omega_h::Read<int>,_4> *local_3c0;
  Alloc *local_3b8;
  element_type *local_3b0;
  element_type *local_3a8;
  int local_3a0;
  undefined8 local_39c;
  int aiStack_394 [3];
  ulong auStack_388 [2];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_318;
  element_type *local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_308;
  element_type *local_300;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f8;
  element_type *local_2f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e8;
  element_type *local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  element_type *local_2d0;
  ulong auStack_2c8 [3];
  element_type *local_2b0;
  element_type *local_2a0;
  element_type *local_290;
  ulong auStack_288 [3];
  Alloc *local_270;
  Alloc *local_260;
  Alloc *local_250;
  SharedAlloc local_248;
  Alloc *local_238;
  Alloc *pAStack_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  ulong local_1d8 [17];
  Adj local_150;
  Alloc *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  Alloc *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  Alloc *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  Alloc *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  Alloc *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  Alloc *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  Alloc *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  ulong auStack_b0 [16];
  
  Mesh::ask_up(&local_150,mesh,1,3);
  local_3d0 = local_150.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_150.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_150.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_3d0 = (Alloc *)((local_150.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_150.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_150.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar12 = local_3d0;
  local_3c8 = (element_type *)local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_3e0 = local_150.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_150.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_150.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_3e0 = (Alloc *)((local_150.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_150.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_150.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar19 = local_3e0;
  local_3d8 = (element_type *)local_150.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_3f0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_150.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_150.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_3f0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_150.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_150.codes.write_.shared_alloc_.alloc)->use_count =
           (local_150.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  _Var7._M_pi = local_3f0._M_pi;
  local_3e8 = (element_type *)local_150.codes.write_.shared_alloc_.direct_ptr;
  Mesh::ask_verts_of((Mesh *)&local_400,(Int)mesh);
  local_3c0 = __return_storage_ptr__;
  Mesh::ask_verts_of((Mesh *)&local_410,(Int)mesh);
  local_348 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  local_368 = (undefined1  [16])0x0;
  local_378 = (undefined1  [16])0x0;
  iVar30 = 2;
  lVar18 = 0;
  do {
    iVar10 = Read<int>::last((Read<int> *)
                             ((long)&keys2prods->array_[1].write_.shared_alloc_.alloc + lVar18));
    local_338._0_8_ = (Alloc *)(local_338 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"","");
    Write<int>::Write((Write<int> *)&local_248,iVar10 * iVar30,(string *)local_338);
    pAVar4 = *(Alloc **)(local_368 + lVar18);
    if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
      piVar1 = &pAVar4->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar4);
        operator_delete(pAVar4,0x48);
      }
    }
    *(Alloc **)(local_368 + lVar18) = local_248.alloc;
    *(void **)(local_368 + lVar18 + 8) = local_248.direct_ptr;
    if ((((undefined1  [16])local_248 & (undefined1  [16])0x7) == (undefined1  [16])0x0 &&
         local_248.alloc != (Alloc *)0x0) && (entering_parallel == 1)) {
      (local_248.alloc)->use_count = (local_248.alloc)->use_count + -1;
      *(size_t *)(local_368 + lVar18) = (local_248.alloc)->size * 8 + 1;
    }
    local_248.alloc = (Alloc *)0x0;
    local_248.direct_ptr = (void *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    bVar20 = entering_parallel;
    lVar18 = lVar18 + 0x10;
    iVar30 = iVar30 + 1;
  } while (lVar18 != 0x30);
  local_120 = (keys2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_120 & 1) == 0) {
    uVar16 = local_120->size;
  }
  else {
    uVar16 = (ulong)local_120 >> 3;
  }
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if ((entering_parallel & 1) == 0) {
      local_120->use_count = local_120->use_count + 1;
    }
    else {
      local_120 = (Alloc *)(local_120->size * 8 + 1);
    }
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (keys2edges->write_).shared_alloc_.direct_ptr;
  local_118._M_pi = p_Var5;
  local_110 = (edge_configs->write_).shared_alloc_.alloc;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      local_110->use_count = local_110->use_count + 1;
    }
    else {
      local_110 = (Alloc *)(local_110->size * 8 + 1);
    }
  }
  pAVar4 = (Alloc *)(edge_configs->write_).shared_alloc_.direct_ptr;
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar4;
  local_100 = pAVar12;
  if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      pAVar12->use_count = pAVar12->use_count + 1;
    }
    else {
      local_100 = (Alloc *)(pAVar12->size * 8 + 1);
    }
  }
  local_f8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_f0 = pAVar19;
  if (((ulong)pAVar19 & 7) == 0 && pAVar19 != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      pAVar19->use_count = pAVar19->use_count + 1;
    }
    else {
      local_f0 = (Alloc *)(pAVar19->size * 8 + 1);
    }
  }
  local_e8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_150.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_e0 = (Alloc *)_Var7._M_pi;
  if (((ulong)_Var7._M_pi & 7) == 0 && (Alloc *)_Var7._M_pi != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      *(int *)&_Var7._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var7._M_pi[3]._vptr__Sp_counted_base + 1;
    }
    else {
      local_e0 = (Alloc *)((long)(_Var7._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
  }
  local_d8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_150.codes.write_.shared_alloc_.direct_ptr;
  local_d0 = (Alloc *)local_400._M_pi;
  if (((ulong)local_400._M_pi & 7) == 0 && (Alloc *)local_400._M_pi != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      *(int *)&local_400._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_400._M_pi[3]._vptr__Sp_counted_base + 1;
    }
    else {
      local_d0 = (Alloc *)((long)(local_400._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
  }
  local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8;
  local_c0 = local_410;
  if (((ulong)local_410 & 7) == 0 && local_410 != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      local_410->use_count = local_410->use_count + 1;
      bVar20 = 0;
    }
    else {
      local_c0 = (Alloc *)(local_410->size * 8 + 1);
      bVar20 = 1;
    }
  }
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408;
  lVar18 = 0x70;
  do {
    plVar6 = *(long **)((long)(keys2prods->array_ + -7) + lVar18);
    *(long **)((long)&local_120 + lVar18) = plVar6;
    if (((ulong)plVar6 & 7) == 0 && plVar6 != (long *)0x0) {
      if ((bVar20 & 1) == 0) {
        *(int *)(plVar6 + 6) = (int)plVar6[6] + 1;
      }
      else {
        *(long *)((long)&local_120 + lVar18) = *plVar6 * 8 + 1;
      }
    }
    *(undefined8 *)((long)&local_118._M_pi + lVar18) =
         *(undefined8 *)((long)keys2prods->array_ + lVar18 + -0x68);
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0xb0);
  lVar18 = 0xb0;
  do {
    plVar6 = *(long **)((long)&local_428 + lVar18);
    *(long **)((long)&local_120 + lVar18) = plVar6;
    if (((ulong)plVar6 & 7) == 0 && plVar6 != (long *)0x0) {
      if ((bVar20 & 1) == 0) {
        *(int *)(plVar6 + 6) = (int)plVar6[6] + 1;
      }
      else {
        *(long *)((long)&local_120 + lVar18) = *plVar6 * 8 + 1;
      }
    }
    *(undefined8 *)((long)&local_118._M_pi + lVar18) = *(undefined8 *)((long)&uStack_420 + lVar18);
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0xf0);
  pAVar12 = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      local_120->use_count = local_120->use_count + 1;
      local_248.direct_ptr = p_Var5;
      local_248.alloc = local_120;
      local_238 = local_110;
      if (local_110 != (Alloc *)0x0 && ((ulong)local_110 & 7) == 0) {
LAB_003f2a97:
        local_248.direct_ptr = p_Var5;
        local_248.alloc = local_120;
        local_110->use_count = local_110->use_count + 1;
        local_238 = local_110;
      }
    }
    else {
      pAVar12 = (Alloc *)(local_120->size * 8 + 1);
      local_248.direct_ptr = p_Var5;
      local_248.alloc = pAVar12;
      local_238 = local_110;
      if (local_110 != (Alloc *)0x0 && ((ulong)local_110 & 7) == 0) goto LAB_003f2a59;
    }
  }
  else {
    local_248.direct_ptr = p_Var5;
    local_248.alloc = local_120;
    local_238 = local_110;
    if (local_110 != (Alloc *)0x0 && ((ulong)local_110 & 7) == 0) {
      if ((bVar20 & 1) == 0) goto LAB_003f2a97;
LAB_003f2a59:
      local_238 = (Alloc *)(local_110->size * 8 + 1);
    }
  }
  pAStack_230 = pAVar4;
  pAVar19 = local_100;
  local_218._0_8_ = local_f0;
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      local_100->use_count = local_100->use_count + 1;
      local_228._8_8_ = local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
      local_228._0_8_ = local_100;
      if (local_f0 != (Alloc *)0x0 && ((ulong)local_f0 & 7) == 0) {
LAB_003f2b6e:
        local_228._8_8_ = local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
        local_228._0_8_ = local_100;
        local_f0->use_count = local_f0->use_count + 1;
      }
    }
    else {
      pAVar19 = (Alloc *)(local_100->size * 8 + 1);
      local_228._8_8_ = local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
      local_228._0_8_ = pAVar19;
      if (local_f0 != (Alloc *)0x0 && ((ulong)local_f0 & 7) == 0) goto LAB_003f2b2e;
    }
  }
  else {
    local_228._8_8_ = local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_228._0_8_ = local_100;
    if (local_f0 != (Alloc *)0x0 && ((ulong)local_f0 & 7) == 0) {
      if ((bVar20 & 1) == 0) goto LAB_003f2b6e;
LAB_003f2b2e:
      local_218._0_8_ = local_f0->size * 8 + 1;
    }
  }
  local_218._8_8_ = local_150.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_4c8 = local_e0;
  local_1f8._0_8_ = local_d0;
  local_1e8._0_8_ = local_c0;
  if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
    if ((bVar20 & 1) == 0) {
      local_e0->use_count = local_e0->use_count + 1;
      local_208._8_8_ = local_150.codes.write_.shared_alloc_.direct_ptr;
      local_208._0_8_ = local_e0;
      if (local_d0 != (Alloc *)0x0 && ((ulong)local_d0 & 7) == 0) goto LAB_003f2c64;
      bVar20 = 0;
    }
    else {
      local_4c8 = (Alloc *)(local_e0->size * 8 + 1);
      local_208._8_8_ = local_150.codes.write_.shared_alloc_.direct_ptr;
      local_208._0_8_ = local_4c8;
      bVar20 = 1;
      if (local_d0 != (Alloc *)0x0 && ((ulong)local_d0 & 7) == 0) {
LAB_003f2c20:
        local_1f8._0_8_ = local_d0->size * 8 + 1;
        bVar20 = 1;
      }
    }
LAB_003f2c9b:
    local_1f8._8_8_ = local_3f8;
    pAVar29 = (Alloc *)local_1f8._0_8_;
    if (local_c0 == (Alloc *)0x0 || ((ulong)local_c0 & 7) != 0) goto LAB_003f2cfe;
    if ((bVar20 & 1) != 0) {
      local_1e8._0_8_ = local_c0->size * 8 + 1;
      bVar20 = 1;
      goto LAB_003f2cfe;
    }
LAB_003f2cf1:
    local_c0->use_count = local_c0->use_count + 1;
  }
  else {
    local_208._8_8_ = local_150.codes.write_.shared_alloc_.direct_ptr;
    local_208._0_8_ = local_e0;
    if (local_d0 == (Alloc *)0x0 || ((ulong)local_d0 & 7) != 0) goto LAB_003f2c9b;
    if ((bVar20 & 1) != 0) goto LAB_003f2c20;
LAB_003f2c64:
    local_208._8_8_ = local_150.codes.write_.shared_alloc_.direct_ptr;
    local_208._0_8_ = local_e0;
    local_d0->use_count = local_d0->use_count + 1;
    local_1f8._8_8_ = local_3f8;
    pAVar29 = local_d0;
    if (local_c0 != (Alloc *)0x0 && ((ulong)local_c0 & 7) == 0) goto LAB_003f2cf1;
  }
  bVar20 = 0;
LAB_003f2cfe:
  local_1e8._8_8_ = local_408;
  lVar18 = 0x70;
  do {
    plVar6 = *(long **)((long)&local_120 + lVar18);
    *(long **)((long)&local_248.alloc + lVar18) = plVar6;
    if (((ulong)plVar6 & 7) == 0 && plVar6 != (long *)0x0) {
      if ((bVar20 & 1) == 0) {
        *(int *)(plVar6 + 6) = (int)plVar6[6] + 1;
      }
      else {
        *(long *)((long)&local_248.alloc + lVar18) = *plVar6 * 8 + 1;
      }
    }
    *(undefined8 *)((long)&local_248.direct_ptr + lVar18) =
         *(undefined8 *)((long)&local_118._M_pi + lVar18);
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0xb0);
  lVar18 = 0xb0;
  do {
    plVar6 = *(long **)((long)&local_120 + lVar18);
    *(long **)((long)&local_248.alloc + lVar18) = plVar6;
    if (((ulong)plVar6 & 7) == 0 && plVar6 != (long *)0x0) {
      if ((bVar20 & 1) == 0) {
        *(int *)(plVar6 + 6) = (int)plVar6[6] + 1;
      }
      else {
        *(long *)((long)&local_248.alloc + lVar18) = *plVar6 * 8 + 1;
      }
    }
    *(undefined8 *)((long)&local_248.direct_ptr + lVar18) =
         *(undefined8 *)((long)&local_118._M_pi + lVar18);
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0xf0);
  local_480 = (int)(uVar16 >> 2);
  if (0 < local_480) {
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      pAVar12->use_count = pAVar12->use_count + -1;
      pAVar12 = (Alloc *)(pAVar12->size * 8 + 1);
    }
    local_338._8_8_ = p_Var5;
    local_338._0_8_ = pAVar12;
    local_248.alloc = (Alloc *)0x0;
    local_248.direct_ptr = (void *)0x0;
    local_338._16_8_ = local_238;
    local_338._24_8_ = pAVar4;
    if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
      local_238->use_count = local_238->use_count + -1;
      local_338._16_8_ = (Alloc *)(local_238->size * 8 + 1);
    }
    pAStack_230 = (Alloc *)0x0;
    local_238 = (Alloc *)0x0;
    local_318._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar19;
    local_310 = (element_type *)local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    if (((ulong)pAVar19 & 7) == 0 && pAVar19 != (Alloc *)0x0) {
      pAVar19->use_count = pAVar19->use_count + -1;
      local_318._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pAVar19->size * 8 + 1);
    }
    local_228 = (undefined1  [16])0x0;
    local_308._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._0_8_;
    local_300 = (element_type *)local_150.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    if ((local_218._0_8_ & 7) == 0 && (Alloc *)local_218._0_8_ != (Alloc *)0x0) {
      *(int *)(local_218._0_8_ + 0x30) = *(int *)(local_218._0_8_ + 0x30) + -1;
      local_308._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(size_t *)local_218._0_8_ * 8 + 1);
    }
    local_218 = (undefined1  [16])0x0;
    local_2f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8;
    local_2f0 = (element_type *)local_150.codes.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_4c8 & 7) == 0 && local_4c8 != (Alloc *)0x0) {
      local_4c8->use_count = local_4c8->use_count + -1;
      local_2f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_4c8->size * 8 + 1);
    }
    local_208 = (undefined1  [16])0x0;
    local_2e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar29;
    local_2e0 = local_3f8;
    if (((ulong)pAVar29 & 7) == 0 && pAVar29 != (Alloc *)0x0) {
      pAVar29->use_count = pAVar29->use_count + -1;
      local_2e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pAVar29->size * 8 + 1);
    }
    local_1f8 = (undefined1  [16])0x0;
    local_2d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._0_8_;
    local_2d0 = local_408;
    if ((local_1e8._0_8_ & 7) == 0 && (Alloc *)local_1e8._0_8_ != (Alloc *)0x0) {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 0x30))->
                    _vptr__Sp_counted_base + -1;
      local_2d8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)*(_func_int ***)local_1e8._0_8_ * 8 + 1);
    }
    local_1e8 = (undefined1  [16])0x0;
    lVar18 = 0x70;
    do {
      plVar6 = *(long **)((long)&local_248.alloc + lVar18);
      uVar14 = *(undefined8 *)((long)&local_248.direct_ptr + lVar18);
      *(long **)(local_338 + lVar18) = plVar6;
      *(undefined8 *)(local_338 + lVar18 + 8) = uVar14;
      if (((ulong)plVar6 & 7) == 0 && plVar6 != (long *)0x0) {
        *(int *)(plVar6 + 6) = (int)plVar6[6] + -1;
        *(long *)(local_338 + lVar18) = *plVar6 * 8 + 1;
      }
      *(undefined1 (*) [16])((long)&local_248.alloc + lVar18) = (undefined1  [16])0x0;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0xb0);
    lVar18 = 0xb0;
    do {
      plVar6 = *(long **)((long)&local_248.alloc + lVar18);
      uVar14 = *(undefined8 *)((long)&local_248.direct_ptr + lVar18);
      *(long **)(local_338 + lVar18) = plVar6;
      *(undefined8 *)(local_338 + lVar18 + 8) = uVar14;
      if (((ulong)plVar6 & 7) == 0 && plVar6 != (long *)0x0) {
        *(int *)(plVar6 + 6) = (int)plVar6[6] + -1;
        *(long *)(local_338 + lVar18) = *plVar6 * 8 + 1;
      }
      *(undefined1 (*) [16])((long)&local_248.alloc + lVar18) = (undefined1  [16])0x0;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0xf0);
    entering_parallel = 0;
    local_3b0 = local_2b0;
    local_3b8 = local_270;
    local_3a8 = local_290;
    lVar18 = 0;
    do {
      lVar13 = (long)*(int *)((long)&p_Var5->_vptr__Sp_counted_base + lVar18 * 4);
      cVar2 = *(char *)((long)&(((Graph *)&pAVar4->size)->a2ab).write_.shared_alloc_.alloc + lVar13)
      ;
      lVar22 = (long)*(int *)((long)&(((Graph *)
                                      local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)->
                                     a2ab).write_.shared_alloc_.alloc + lVar13 * 4);
      uVar16 = *(int *)((long)&(((Graph *)local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr
                                )->a2ab).write_.shared_alloc_.alloc + lVar13 * 4 + 4) - lVar22;
      iVar30 = (int)uVar16;
      local_3a0 = iVar30;
      if (iVar30 < 8) {
        if (iVar30 < 3) {
          uVar14 = 0x20;
          pcVar24 = "loop.size >= 3";
LAB_003f3874:
          fail("assertion %s failed at %s +%d\n",pcVar24,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_swap3d_loop.hpp"
               ,uVar14);
        }
        local_39c = (&local_3f8->library_)[lVar13];
        local_428 = 0xffffffff;
        uStack_424 = 0xffffffff;
        uStack_420 = 0xffffffff;
        uStack_41c = 0xffffffff;
        local_438 = 0xffffffff;
        uStack_434 = 0xffffffff;
        uStack_430 = 0xffffffff;
        uStack_42c = 0xffffffff;
        local_448[0] = -1;
        local_448[1] = 0xffffffff;
        uStack_440._0_4_ = 0xffffffff;
        uStack_440._4_4_ = 0xffffffff;
        local_418 = 0xffffffffffffffff;
        uVar27 = 0;
        do {
          lVar13 = lVar22 + uVar27;
          bVar20 = *(byte *)((long)&(((Graph *)local_150.codes.write_.shared_alloc_.direct_ptr)->
                                    a2ab).write_.shared_alloc_.alloc + lVar13);
          bVar21 = (char)bVar20 >> 3;
          uVar31 = 0xffffffff;
          if (bVar21 < 6) {
            uVar31 = *(uint *)(&DAT_00442bb8 + (ulong)bVar21 * 4);
          }
          iVar10 = *(int *)((long)&(((Graph *)
                                    local_150.super_Graph.ab2b.write_.shared_alloc_.direct_ptr)->
                                   a2ab).write_.shared_alloc_.alloc + lVar13 * 4);
          uVar17 = bVar20 >> 1 & 3;
          uVar28 = (ulong)uVar17;
          uVar23 = 0;
          bVar9 = true;
          do {
            bVar11 = bVar9;
            if (5 < uVar31) {
              iVar26 = -1;
              goto LAB_003f3286;
            }
            uVar25 = (uint)uVar23 ^ uVar17;
            switch(uVar31) {
            case 0:
              if (uVar23 == uVar28) {
LAB_003f323e:
                iVar26 = 0;
              }
              else {
                iVar26 = (uint)(uVar25 == 1) * 2 + -1;
              }
              break;
            case 1:
              iVar26 = 1;
              if (uVar23 != uVar28) {
                iVar26 = (uint)(uVar25 == 1) * 3 + -1;
              }
              break;
            case 2:
              iVar26 = 2;
              if (uVar23 != uVar28) {
                iVar26 = -(uint)(uVar25 != 1);
              }
              break;
            case 3:
              if (uVar23 == uVar28) goto LAB_003f323e;
              goto LAB_003f326c;
            case 4:
              iVar26 = 1;
              goto LAB_003f3267;
            case 5:
              iVar26 = 2;
LAB_003f3267:
              if (uVar23 != uVar28) {
LAB_003f326c:
                iVar26 = (uint)(uVar25 == 1) * 4 + -1;
              }
            }
LAB_003f3286:
            local_448[uVar27 * 2 + uVar23] =
                 *(int *)((long)&(&((Graph *)&local_408->library_)->a2ab)[iVar10].write_.
                                 shared_alloc_.alloc + (long)iVar26 * 4);
            uVar23 = 1;
            bVar9 = false;
          } while (bVar11);
          uVar27 = uVar27 + 1;
        } while (uVar27 != (uVar16 & 0xffffffff));
        uVar27 = 1;
        uVar28 = 0;
        do {
          uVar14 = 0x47;
          if (uVar28 == iVar30 - 1) {
LAB_003f386d:
            pcVar24 = "j < loop.size";
            goto LAB_003f3874;
          }
          lVar13 = uVar28 * 2;
          uVar28 = uVar28 + 1;
          uVar23 = uVar27;
          while (local_448[uVar23 * 2] != local_448[lVar13 + 1]) {
            uVar23 = uVar23 + 1;
            if (iVar30 <= (int)uVar23) goto LAB_003f386d;
          }
          uVar14 = *(undefined8 *)(local_448 + uVar28 * 2);
          *(undefined8 *)(local_448 + uVar28 * 2) =
               *(undefined8 *)(local_448 + (uVar23 & 0xffffffff) * 2);
          *(undefined8 *)(local_448 + (uVar23 & 0xffffffff) * 2) = uVar14;
          uVar27 = uVar27 + 1;
        } while (uVar28 != iVar30 - 1);
        uVar27 = 0;
        do {
          aiStack_394[uVar27] = local_448[uVar27 * 2];
          uVar27 = uVar27 + 1;
        } while ((uVar16 & 0xffffffff) != uVar27);
      }
      uVar31 = *(uint *)(swap3d::swap_mesh_sizes + uVar16 * 4);
      uVar27 = (ulong)uVar31;
      uVar17 = *(uint *)(swap3d::nedges + uVar16 * 4);
      if ((uVar16 & 0xfffffffffffffffc) == 4) {
        lVar13 = *(long *)(*(long *)(swap3d::edges2unique + uVar16 * 8) + (long)cVar2 * 8);
        lVar22 = *(long *)(swap3d::unique_edges + uVar16 * 8);
        uVar28 = 1;
        if (1 < (int)uVar17) {
          uVar28 = (ulong)uVar17;
        }
        uVar23 = 0;
        do {
          lVar15 = (long)*(int *)(lVar13 + uVar23 * 4);
          iVar30 = aiStack_394[*(int *)(lVar22 + lVar15 * 8)];
          iVar10 = aiStack_394[*(int *)(lVar22 + 4 + lVar15 * 8)];
          lVar15 = (long)(int)uVar23 +
                   (long)*(int *)((long)&(local_3b0->super_Graph).a2ab.write_.shared_alloc_.alloc +
                                 lVar18 * 4);
          *(int *)(&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                    &local_3b8->size)->_M_ptr + lVar15) = iVar30;
          *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                          &local_3b8->size)->_M_ptr + lVar15 * 8 + 4) = iVar10;
          lVar15 = 0;
          bVar9 = true;
          do {
            bVar11 = bVar9;
            uVar3 = *(undefined4 *)((long)&local_39c + lVar15 * 4);
            lVar15 = (long)(int)((((uint)lVar15 | (int)uVar23 * 2) +
                                 *(int *)((long)&(local_2a0->super_Graph).a2ab.write_.shared_alloc_.
                                                 alloc + lVar18 * 4)) * 3);
            *(ulong *)((long)&local_260->size + lVar15 * 4) = CONCAT44(iVar10,iVar30);
            *(undefined4 *)((long)&(local_260->name)._M_dataplus._M_p + lVar15 * 4) = uVar3;
            lVar15 = 1;
            bVar9 = false;
          } while (bVar11);
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar28);
      }
      if (uVar16 - 3 < 5) {
        if ((int)uVar31 < 2) {
          uVar27 = 1;
        }
        lVar13 = *(long *)(swap3d::swap_meshes + uVar16 * 8);
        lVar22 = *(long *)(swap3d::swap_triangles + uVar16 * 8);
        uVar16 = 0;
        do {
          iVar30 = *(int *)((long)(int)((int)cVar2 * uVar31) * 4 + lVar13 + uVar16 * 4);
          lVar15 = 0;
          do {
            local_448[lVar15] = aiStack_394[*(int *)(lVar22 + (long)iVar30 * 0xc + lVar15 * 4)];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          lVar15 = (long)(int)((uVar17 * 2 + (int)uVar16 +
                               *(int *)((long)&(local_2a0->super_Graph).a2ab.write_.shared_alloc_.
                                               alloc + lVar18 * 4)) * 3);
          *(undefined4 *)((long)&(local_260->name)._M_dataplus._M_p + lVar15 * 4) =
               (undefined4)uStack_440;
          *(ulong *)((long)&local_260->size + lVar15 * 4) = CONCAT44(local_448[1],local_448[0]);
          uVar25 = 0;
          bVar9 = true;
          do {
            bVar11 = bVar9;
            lVar15 = (long)(int)(((uVar25 | (int)uVar16 * 2) +
                                 *(int *)((long)&(local_3a8->super_Graph).a2ab.write_.shared_alloc_.
                                                 alloc + lVar18 * 4)) * 4);
            uVar25 = 1;
            uVar3 = local_39c._4_4_;
            iVar30 = local_448[1];
            iVar10 = (undefined4)uStack_440;
            if (bVar11) {
              uVar3 = (undefined4)local_39c;
              iVar30 = (undefined4)uStack_440;
              iVar10 = local_448[1];
            }
            *(int *)((long)&local_250->size + lVar15 * 4) = local_448[0];
            *(int *)((long)&local_250->size + lVar15 * 4 + 4) = iVar30;
            *(int *)((long)&(local_250->name)._M_dataplus._M_p + lVar15 * 4) = iVar10;
            *(undefined4 *)((long)&(local_250->name)._M_dataplus._M_p + lVar15 * 4 + 4) = uVar3;
            bVar9 = false;
          } while (bVar11);
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar27);
      }
      lVar18 = lVar18 + 1;
    } while ((int)lVar18 != local_480);
    swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
    ::$_0::~__0((__0 *)local_338);
  }
  swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
  ::$_0::~__0((__0 *)&local_248);
  pHVar8 = local_3c0;
  local_3c0->array_[3].write_.shared_alloc_ = (SharedAlloc)0x0;
  local_3c0->array_[2].write_.shared_alloc_ = (SharedAlloc)0x0;
  local_3c0->array_[1].write_.shared_alloc_ = (SharedAlloc)0x0;
  local_3c0->array_[0].write_.shared_alloc_ = (SharedAlloc)0x0;
  lVar18 = 0x18;
  do {
    local_458.shared_alloc_.alloc = *(Alloc **)((long)auStack_388 + lVar18 + 8);
    if (((ulong)local_458.shared_alloc_.alloc & 7) == 0 &&
        local_458.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == 1) {
        local_458.shared_alloc_.alloc = (Alloc *)((local_458.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_458.shared_alloc_.alloc)->use_count = (local_458.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_458.shared_alloc_.direct_ptr = *(void **)(local_378 + lVar18);
    Read<int>::Read((Read<signed_char> *)local_338,&local_458);
    pAVar12 = *(Alloc **)((long)pHVar8->array_ + lVar18 + -8);
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      piVar1 = &pAVar12->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar12);
        operator_delete(pAVar12,0x48);
      }
    }
    pAVar12 = local_458.shared_alloc_.alloc;
    *(undefined8 *)((long)pHVar8->array_ + lVar18 + -8) = local_338._0_8_;
    *(undefined8 *)((long)&pHVar8->array_[0].write_.shared_alloc_.alloc + lVar18) = local_338._8_8_;
    if (((local_338._0_16_ & (undefined1  [16])0x7) == (undefined1  [16])0x0 &&
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._0_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (entering_parallel == 1)) {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_338._0_8_ + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_338._0_8_ + 0x30))->
                    _vptr__Sp_counted_base + -1;
      *(long *)((long)pHVar8->array_ + lVar18 + -8) = *(long *)local_338._0_8_ * 8 + 1;
    }
    local_338._0_8_ = (Alloc *)0x0;
    local_338._8_8_ = (void *)0x0;
    if (((ulong)local_458.shared_alloc_.alloc & 7) == 0 &&
        local_458.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_458.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_458.shared_alloc_.alloc);
        operator_delete(pAVar12,0x48);
      }
    }
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x48);
  swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
  ::$_0::~__0((__0 *)&local_120);
  lVar18 = 0x40;
  do {
    pAVar12 = *(Alloc **)((long)auStack_388 + lVar18);
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      piVar1 = &pAVar12->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar12);
        operator_delete(pAVar12,0x48);
      }
    }
    lVar18 = lVar18 + -0x10;
  } while (lVar18 != 0);
  if (((ulong)local_410 & 7) == 0 && local_410 != (Alloc *)0x0) {
    piVar1 = &local_410->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_410);
      operator_delete(local_410,0x48);
    }
  }
  if (((ulong)local_400._M_pi & 7) == 0 && (Alloc *)local_400._M_pi != (Alloc *)0x0) {
    p_Var5 = local_400._M_pi + 3;
    *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_400._M_pi);
      operator_delete(local_400._M_pi,0x48);
    }
  }
  _Var7._M_pi = local_3f0._M_pi;
  if (((ulong)local_3f0._M_pi & 7) == 0 && (Alloc *)local_3f0._M_pi != (Alloc *)0x0) {
    p_Var5 = local_3f0._M_pi + 3;
    *(int *)&p_Var5->_vptr__Sp_counted_base = *(int *)&p_Var5->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var5->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_3f0._M_pi);
      operator_delete(_Var7._M_pi,0x48);
    }
  }
  pAVar12 = local_3e0;
  if (((ulong)local_3e0 & 7) == 0 && local_3e0 != (Alloc *)0x0) {
    piVar1 = &local_3e0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_3e0);
      operator_delete(pAVar12,0x48);
    }
  }
  pAVar12 = local_3d0;
  if (((ulong)local_3d0 & 7) == 0 && local_3d0 != (Alloc *)0x0) {
    piVar1 = &local_3d0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_3d0);
      operator_delete(pAVar12,0x48);
    }
  }
  Adj::~Adj(&local_150);
  return pHVar8;
}

Assistant:

HostFew<LOs, 4> swap3d_topology(Mesh* mesh, LOs keys2edges,
    Read<I8> edge_configs, HostFew<LOs, 4> keys2prods) {
  auto edges2tets = mesh->ask_up(EDGE, REGION);
  auto edges2edge_tets = edges2tets.a2ab;
  auto edge_tets2tets = edges2tets.ab2b;
  auto edge_tet_codes = edges2tets.codes;
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto tet_verts2verts = mesh->ask_verts_of(REGION);
  HostFew<Write<LO>, 4> prod_verts2verts_w;
  for (Int prod_dim = EDGE; prod_dim <= REGION; ++prod_dim) {
    prod_verts2verts_w[prod_dim] =
        Write<LO>(keys2prods[prod_dim].last() * Int(prod_dim + 1));
  }
  auto nkeys = keys2edges.size();
  auto f = OMEGA_H_LAMBDA(LO key) {
    auto edge = keys2edges[key];
    auto config = edge_configs[edge];
    auto loop = swap3d::find_loop(edges2edge_tets, edge_tets2tets,
        edge_tet_codes, edge_verts2verts, tet_verts2verts, edge);
    auto nplane_tris = swap3d::swap_mesh_sizes[loop.size];
    auto nplane_edges = swap3d::nedges[loop.size];
    for (Int plane_edge = 0; plane_edge < nplane_edges; ++plane_edge) {
      auto unique_edge = swap3d::edges2unique[loop.size][config][plane_edge];
      Few<LO, 2> plane_edge_verts;
      for (Int pev = 0; pev < 2; ++pev) {
        auto loop_vert = swap3d::unique_edges[loop.size][unique_edge][pev];
        auto vert = loop.loop_verts2verts[loop_vert];
        plane_edge_verts[pev] = vert;
      }
      auto prod_edge = keys2prods[EDGE][key] + plane_edge;
      for (Int pev = 0; pev < 2; ++pev) {
        prod_verts2verts_w[EDGE][prod_edge * 2 + pev] = plane_edge_verts[pev];
      }
      for (Int eev = 0; eev < 2; ++eev) {
        Few<LO, 3> new_tri_verts;
        for (Int nfv = 0; nfv < 2; ++nfv) {
          new_tri_verts[nfv] = plane_edge_verts[nfv];
        }
        new_tri_verts[2] = loop.eev2v[eev];
        auto prod_tri = keys2prods[FACE][key] + 2 * plane_edge + eev;
        for (Int nfv = 0; nfv < 3; ++nfv) {
          prod_verts2verts_w[FACE][prod_tri * 3 + nfv] = new_tri_verts[nfv];
        }
      }
    }
    for (Int plane_tri = 0; plane_tri < nplane_tris; ++plane_tri) {
      auto uniq_tri =
          swap3d::swap_meshes[loop.size][config * nplane_tris + plane_tri];
      Few<LO, 3> plane_tri_verts;
      for (Int pfv = 0; pfv < 3; ++pfv) {
        auto loop_vert = swap3d::swap_triangles[loop.size][uniq_tri][pfv];
        auto vert = loop.loop_verts2verts[loop_vert];
        plane_tri_verts[pfv] = vert;
      }
      auto prod_tri = keys2prods[FACE][key] + 2 * nplane_edges + plane_tri;
      for (Int pfv = 0; pfv < 3; ++pfv) {
        prod_verts2verts_w[FACE][prod_tri * 3 + pfv] = plane_tri_verts[pfv];
      }
      for (Int eev = 0; eev < 2; ++eev) {
        auto prod_tet = keys2prods[REGION][key] + 2 * plane_tri + eev;
        Few<LO, 4> new_tet_verts;
        for (Int pfv = 0; pfv < 3; ++pfv) {
          new_tet_verts[pfv] = plane_tri_verts[pfv];
        }
        if (eev == 0) swap2(new_tet_verts[1], new_tet_verts[2]);
        new_tet_verts[3] = loop.eev2v[eev];
        for (Int nrv = 0; nrv < 4; ++nrv) {
          prod_verts2verts_w[REGION][prod_tet * 4 + nrv] = new_tet_verts[nrv];
        }
      }
    }
  };
  parallel_for(nkeys, f, "swap3d_topology");
  HostFew<LOs, 4> prod_verts2verts;
  for (Int prod_dim = EDGE; prod_dim <= REGION; ++prod_dim) {
    prod_verts2verts[prod_dim] = prod_verts2verts_w[prod_dim];
  }
  return prod_verts2verts;
}